

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrestreply.cpp
# Opt level: O3

QByteArray * __thiscall QRestReply::readBody(QByteArray *__return_storage_ptr__,QRestReply *this)

{
  Data *pDVar1;
  
  pDVar1 = (this->wrapped).wp.d;
  if ((pDVar1 == (Data *)0x0) ||
     ((this->wrapped).wp.value == (QObject *)0x0 ||
      (pDVar1->strongref)._q_value.super___atomic_base<int>._M_i == 0)) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    QIODevice::readAll();
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QRestReply::readBody()
{
    return wrapped ? wrapped->readAll() : QByteArray{};
}